

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O0

void qSetMessagePattern(QString *pattern)

{
  long lVar1;
  Type *pTVar2;
  long in_FS_OFFSET;
  scoped_lock<QBasicMutex> locker;
  QString *in_stack_00000258;
  QMessagePattern *in_stack_00000260;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qMessagePattern>_>
  *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (anonymous_namespace)::qt_scoped_lock<QBasicMutex,std::scoped_lock<QBasicMutex>>
            ((QBasicMutex *)in_stack_ffffffffffffffb8);
  pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qMessagePattern>_>::
           operator()(in_stack_ffffffffffffffb8);
  if ((pTVar2->fromEnvironment & 1U) == 0) {
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qMessagePattern>_>::operator()
              (in_stack_ffffffffffffffb8);
    QMessagePattern::setPattern(in_stack_00000260,in_stack_00000258);
  }
  std::scoped_lock<QBasicMutex>::~scoped_lock((scoped_lock<QBasicMutex> *)0x247ec7);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qSetMessagePattern(const QString &pattern)
{
    const auto locker = qt_scoped_lock(QMessagePattern::mutex);

    if (!qMessagePattern()->fromEnvironment)
        qMessagePattern()->setPattern(pattern);
}